

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventStream.cpp
# Opt level: O0

bool binlog::operator==(WriterProp *a,WriterProp *b)

{
  __type _Var1;
  long *in_RSI;
  long *in_RDI;
  bool local_11;
  
  local_11 = false;
  if (*in_RDI == *in_RSI) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)b);
    local_11 = false;
    if (_Var1) {
      local_11 = in_RDI[5] == in_RSI[5];
    }
  }
  return local_11;
}

Assistant:

bool operator==(const WriterProp& a, const WriterProp& b)
{
  return a.id == b.id
    &&   a.name == b.name
    &&   a.batchSize == b.batchSize;
}